

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::block<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool folded)

{
  __index_type *__return_storage_ptr___00;
  optional<wasm::Name> oVar1;
  bool bVar2;
  __optional_ne_t<wasm::Name,_wasm::Name> _Var3;
  size_t sVar4;
  HeapType *pHVar5;
  Err *pEVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  Result<wasm::Ok> local_2e0;
  allocator<char> local_2b1;
  string local_2b0;
  Err local_290;
  undefined1 local_270 [8];
  optional<wasm::Name> id;
  string local_250;
  Err local_230;
  basic_string_view<char,_std::char_traits<char>_> local_210;
  allocator<char> local_1f9;
  string local_1f8;
  Err local_1d8;
  Err local_1b8;
  Err *local_198;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Err *err_1;
  undefined1 local_120 [8];
  Result<wasm::Ok> _val_1;
  Err local_f0;
  Err *local_d0;
  Err *err;
  undefined1 local_b8 [8];
  Result<wasm::HeapType> _val;
  Result<wasm::HeapType> type;
  optional<wasm::Name> label;
  Index local_30;
  size_t pos;
  bool folded_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  ParseModuleTypesCtx *ctx_local;
  
  sVar4 = Lexer::getPos(&ctx->in);
  if (folded) {
    bVar7 = sv("block",5);
    bVar2 = Lexer::takeSExprStart(&ctx->in,bVar7);
    if (!bVar2) goto LAB_024670fe;
  }
  if (!folded) {
    bVar7 = sv("block",5);
    bVar2 = Lexer::takeKeyword(&ctx->in,bVar7);
    if (!bVar2) {
LAB_024670fe:
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  Lexer::takeID((optional<wasm::Name> *)
                ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20),&ctx->in);
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20);
  blocktype<wasm::WATParser::ParseModuleTypesCtx>
            ((Result<wasm::HeapType> *)__return_storage_ptr___00,ctx);
  Result<wasm::HeapType>::Result
            ((Result<wasm::HeapType> *)local_b8,(Result<wasm::HeapType> *)__return_storage_ptr___00)
  ;
  local_d0 = Result<wasm::HeapType>::getErr((Result<wasm::HeapType> *)local_b8);
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_1_ = local_d0 != (Err *)0x0;
  if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
    wasm::Err::Err(&local_f0,local_d0);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_f0);
    wasm::Err::~Err(&local_f0);
  }
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _37_3_ = 0;
  Result<wasm::HeapType>::~Result((Result<wasm::HeapType> *)local_b8);
  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
    local_30 = (Index)sVar4;
    pHVar5 = Result<wasm::HeapType>::operator*
                       ((Result<wasm::HeapType> *)
                        ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                                super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20));
    oVar1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str =
         (char *)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                 _M_len;
    oVar1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len =
         type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
         super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
         super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
         super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
         super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
         super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_;
    oVar1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._16_8_ =
         label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str;
    NullInstrParserCtx::makeBlock<wasm::HeapType>
              ((Result<wasm::Ok> *)local_120,(NullInstrParserCtx *)ctx,local_30,annotations,oVar1,
               (HeapType)pHVar5->id);
    pEVar6 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_120);
    if (pEVar6 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar6);
      MaybeResult<wasm::Ok>::MaybeResult
                (__return_storage_ptr__,
                 (Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar6 != (Err *)0x0;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_120);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
      instrs<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Ok> *)&err_2,ctx);
      local_198 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
      bVar2 = local_198 != (Err *)0x0;
      if (bVar2) {
        wasm::Err::Err(&local_1b8,local_198);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1b8);
        wasm::Err::~Err(&local_1b8);
      }
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar2;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
        if (folded) {
          bVar2 = Lexer::takeRParen(&ctx->in);
          if (!bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f8,"expected \')\' at end of block",&local_1f9);
            Lexer::err(&local_1d8,&ctx->in,&local_1f8);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1d8);
            wasm::Err::~Err(&local_1d8);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::allocator<char>::~allocator(&local_1f9);
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
            goto LAB_024678f0;
          }
        }
        else {
          local_210 = sv("end",3);
          bVar2 = Lexer::takeKeyword(&ctx->in,local_210);
          if (!bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_250,"expected \'end\' at end of block",
                       (allocator<char> *)
                       &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>.field_0x17);
            Lexer::err(&local_230,&ctx->in,&local_250);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_230);
            wasm::Err::~Err(&local_230);
            std::__cxx11::string::~string((string *)&local_250);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>.field_0x17);
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
            goto LAB_024678f0;
          }
          Lexer::takeID((optional<wasm::Name> *)local_270,&ctx->in);
          bVar2 = std::optional::operator_cast_to_bool((optional *)local_270);
          if ((bVar2) &&
             (_Var3 = std::operator!=((optional<wasm::Name> *)local_270,
                                      (optional<wasm::Name> *)
                                      ((long)&type.val.
                                              super__Variant_base<wasm::HeapType,_wasm::Err>.
                                              super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                                              super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                                              super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                                              super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> +
                                      0x20)), _Var3)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2b0,"end label does not match block label",&local_2b1);
            Lexer::err(&local_290,&ctx->in,&local_2b0);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_290);
            wasm::Err::~Err(&local_290);
            std::__cxx11::string::~string((string *)&local_2b0);
            std::allocator<char>::~allocator(&local_2b1);
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
            goto LAB_024678f0;
          }
        }
        NullInstrParserCtx::visitEnd(&local_2e0,(NullInstrParserCtx *)ctx);
        MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_2e0);
        Result<wasm::Ok>::~Result(&local_2e0);
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
      }
    }
  }
LAB_024678f0:
  Result<wasm::HeapType>::~Result
            ((Result<wasm::HeapType> *)
             ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<>
block(Ctx& ctx, const std::vector<Annotation>& annotations, bool folded) {
  auto pos = ctx.in.getPos();

  if ((folded && !ctx.in.takeSExprStart("block"sv)) ||
      (!folded && !ctx.in.takeKeyword("block"sv))) {
    return {};
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  CHECK_ERR(ctx.makeBlock(pos, annotations, label, *type));

  CHECK_ERR(instrs(ctx));

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of block");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of block");
    }
    auto id = ctx.in.takeID();
    if (id && id != label) {
      return ctx.in.err("end label does not match block label");
    }
  }

  return ctx.visitEnd();
}